

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

void __thiscall
dap::BasicTypeInfo<dap::DisassembledInstruction>::destruct
          (BasicTypeInfo<dap::DisassembledInstruction> *this,void *ptr)

{
  if (*(long **)((long)ptr + 0x1e0) != (long *)((long)ptr + 0x1f0)) {
    operator_delete(*(long **)((long)ptr + 0x1e0),*(long *)((long)ptr + 0x1f0) + 1);
  }
  Source::~Source((Source *)((long)ptr + 0xa8));
  if (*(long **)((long)ptr + 0x70) != (long *)((long)ptr + 0x80)) {
    operator_delete(*(long **)((long)ptr + 0x70),*(long *)((long)ptr + 0x80) + 1);
  }
  if (*(long **)((long)ptr + 0x50) != (long *)((long)ptr + 0x60)) {
    operator_delete(*(long **)((long)ptr + 0x50),*(long *)((long)ptr + 0x60) + 1);
  }
  if (*ptr != (long *)((long)ptr + 0x10)) {
    operator_delete(*ptr,*(long *)((long)ptr + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }